

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gkc.c
# Opt level: O1

uint64_t gkc_query(gkc_summary *s,double q)

{
  bool bVar1;
  list *in_RAX;
  list *plVar2;
  list *plVar3;
  list **pplVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if ((s->head).next == &s->head) {
    return 0;
  }
  dVar6 = ((double)CONCAT44(0x45300000,(int)(s->nr_elems >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)s->nr_elems) - 4503599627370496.0);
  dVar6 = (double)(int)(q * dVar6 + 0.5) + dVar6 * s->epsilon;
  dVar5 = 0.0;
  plVar2 = (s->head).next;
  do {
    plVar3 = plVar2->next;
    pplVar4 = &plVar2[-2].next;
    if (plVar3 == &s->head) {
LAB_00121672:
      in_RAX = *pplVar4;
      bVar1 = false;
      plVar3 = plVar2;
    }
    else {
      dVar5 = dVar5 + (double)plVar2[-1].prev;
      dVar7 = (double)plVar3[-1].prev + dVar5;
      bVar1 = true;
      if (dVar6 < ((double)CONCAT44(0x45300000,(int)((ulong)plVar3[-1].next >> 0x20)) -
                  1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)plVar3[-1].next) - 4503599627370496.0) + dVar7)
      {
        if (dVar7 <= dVar6) {
          pplVar4 = &plVar3[-2].next;
        }
        goto LAB_00121672;
      }
    }
    plVar2 = plVar3;
    if (!bVar1) {
      return (uint64_t)in_RAX;
    }
  } while( true );
}

Assistant:

uint64_t gkc_query(struct gkc_summary *s, double q)
{
    struct list *cur, *next;
    int rank;
    double gi;
    double ne;

    rank = 0.5 + q * s->nr_elems;
    ne = s->nr_elems * s->epsilon;
    gi = 0;
    if (list_empty(&s->head)) {
        return 0;
    }

    cur = s->head.next;

    while (1) {
        struct gkc_tuple *tcur, *tnext;

        tcur = list_to_tuple(cur);
        next = cur->next;
        if (next == &s->head) {
            return tcur->value;
        }
        tnext = list_to_tuple(next);

        gi += tcur->g;
        if ((rank + ne) < (gi + tnext->g + tnext->delta)) {
            if ((rank + ne) < (gi + tnext->g)) {
                return tcur->value;
            }
            return tnext->value;
        }
        cur = next;
    }
}